

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

void __thiscall Satyricon::SATSolver::cancel_until(SATSolver *this,int level)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  size_type sVar3;
  int level_local;
  SATSolver *this_local;
  
  if (1 < this->log_level) {
    poVar2 = std::operator<<((ostream *)&std::cout,"backtrack from ");
    iVar1 = current_level(this);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," to ");
    this_00 = (void *)std::ostream::operator<<(poVar2,level);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  while (iVar1 = current_level(this), level < iVar1) {
    cancel(this);
  }
  sVar3 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->trail);
  this->propagation_starting_pos = sVar3;
  return;
}

Assistant:

void SATSolver::cancel_until( int level ) {
    PRINT_VERBOSE("backtrack from " << current_level() <<
            " to " << level << endl);
    while ( current_level() > level )
        cancel();
    propagation_starting_pos = trail.size();
}